

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

DynamicObject * __thiscall
Js::JavascriptLibrary::CreateObject
          (JavascriptLibrary *this,bool allowObjectHeaderInlining,
          PropertyIndex requestedInlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  undefined4 *puVar4;
  DynamicType *type;
  Type *pTVar5;
  DynamicObject *pDVar6;
  
  if (this->objectTypes[0].ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6d,"(GetObjectType())","GetObjectType()");
    if (!bVar2) goto LAB_00be405f;
    *puVar4 = 0;
  }
  if (this->objectHeaderInlinedTypes[0].ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a6e,"(GetObjectHeaderInlinedType())",
                                "GetObjectHeaderInlinedType()");
    if (!bVar2) {
LAB_00be405f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (allowObjectHeaderInlining) {
    bVar2 = FunctionBody::DoObjectHeaderInliningForObjectLiteral((uint)requestedInlineSlotCapacity);
    if (bVar2) {
      type = GetObjectHeaderInlinedLiteralType(this,requestedInlineSlotCapacity);
      goto LAB_00be404b;
    }
  }
  if (requestedInlineSlotCapacity < 0x11) {
    PVar3 = DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);
    pTVar5 = (Type *)((long)&this->objectTypes[0].ptr + (ulong)(PVar3 & 0xfffe) * 4);
  }
  else {
    pTVar5 = this->objectTypes + 8;
  }
  type = pTVar5->ptr;
LAB_00be404b:
  pDVar6 = DynamicObject::New(this->recycler,type);
  return pDVar6;
}

Assistant:

DynamicObject* JavascriptLibrary::CreateObject(
        const bool allowObjectHeaderInlining,
        const PropertyIndex requestedInlineSlotCapacity)
    {
        Assert(GetObjectType());
        Assert(GetObjectHeaderInlinedType());

        const bool useObjectHeaderInlining =
            allowObjectHeaderInlining && FunctionBody::DoObjectHeaderInliningForObjectLiteral(requestedInlineSlotCapacity);
        DynamicType *const type =
            useObjectHeaderInlining
            ? GetObjectHeaderInlinedLiteralType(requestedInlineSlotCapacity)
            : GetObjectLiteralType(requestedInlineSlotCapacity);
        return DynamicObject::New(GetRecycler(), type);
    }